

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O0

void __thiscall
duckdb::WindowRowNumberGlobalState::~WindowRowNumberGlobalState(WindowRowNumberGlobalState *this)

{
  WindowExecutorGlobalState *in_RDI;
  
  (in_RDI->super_WindowExecutorState)._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowRowNumberGlobalState_03535b38;
  unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>::
  ~unique_ptr((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
               *)0x1a9b07a);
  WindowExecutorGlobalState::~WindowExecutorGlobalState(in_RDI);
  return;
}

Assistant:

WindowRowNumberGlobalState(const WindowRowNumberExecutor &executor, const idx_t payload_count,
	                           const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowExecutorGlobalState(executor, payload_count, partition_mask, order_mask),
	      ntile_idx(executor.ntile_idx) {
		if (!executor.arg_order_idx.empty()) {
			use_framing = true;

			//	If the argument order is prefix of the partition ordering,
			//	then we can just use the partition ordering.
			auto &wexpr = executor.wexpr;
			auto &arg_orders = executor.wexpr.arg_orders;
			const auto optimize = ClientConfig::GetConfig(executor.context).enable_optimizer;
			if (!optimize || BoundWindowExpression::GetSharedOrders(wexpr.orders, arg_orders) != arg_orders.size()) {
				//	"The ROW_NUMBER function can be computed by disambiguating duplicate elements based on their
				//	position in the input data, such that two elements never compare as equal."
				token_tree = make_uniq<WindowTokenTree>(executor.context, executor.wexpr.arg_orders,
				                                        executor.arg_order_idx, payload_count, true);
			}
		}
	}